

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix33.h
# Opt level: O2

void __thiscall
chrono::ChMatrix33<double>::Set_A_Eulero(ChMatrix33<double> *this,ChVector<double> *angles)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 extraout_var [56];
  
  dVar1 = cos(angles->m_data[0]);
  dVar2 = cos(angles->m_data[1]);
  dVar3 = cos(angles->m_data[2]);
  dVar4 = sin(angles->m_data[0]);
  dVar5 = sin(angles->m_data[1]);
  auVar6._0_8_ = sin(angles->m_data[2]);
  auVar6._8_56_ = extraout_var;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar4;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar4 * -dVar2 * auVar6._0_8_;
  auVar9 = vfmadd231sd_fma(auVar9,auVar12,auVar11);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar3 * dVar4 * -dVar2;
  auVar7 = vfnmadd231sd_fma(auVar7,auVar6._0_16_,auVar11);
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar9._0_8_;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar7._0_8_;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       dVar5 * dVar4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1 * dVar2 * auVar6._0_8_;
  auVar9 = vfmadd231sd_fma(auVar10,auVar12,auVar13);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1 * dVar2 * dVar3;
  auVar7 = vfnmadd231sd_fma(auVar8,auVar6._0_16_,auVar13);
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar9._0_8_;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar7._0_8_;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       dVar1 * -dVar5;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       dVar5 * auVar6._0_8_;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       dVar5 * dVar3;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = dVar2;
  return;
}

Assistant:

inline void ChMatrix33<Real>::Set_A_Eulero(const ChVector<Real>& angles) {
    Real cx = std::cos(angles.x());
    Real cy = std::cos(angles.y());
    Real cz = std::cos(angles.z());
    Real sx = std::sin(angles.x());
    Real sy = std::sin(angles.y());
    Real sz = std::sin(angles.z());

    (*this)(0, 0) = (cz * cx) - (cy * sx * sz);
    (*this)(0, 1) = -(sz * cx) - (cy * sx * cz);
    (*this)(0, 2) = sy * sx;
    (*this)(1, 0) = (cz * sx) + (cy * cx * sz);
    (*this)(1, 1) = -(sz * sx) + (cy * cx * cz);
    (*this)(1, 2) = -sy * cx;
    (*this)(2, 0) = sy * sz;
    (*this)(2, 1) = sy * cz;
    (*this)(2, 2) = cy;
}